

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-512.c
# Opt level: O1

void pp_crypto_hash_sha2_512_process(PHashSHA2_512 *ctx,puint64 *data)

{
  long lVar1;
  long lVar2;
  puint64 *ppVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long alStack_338 [6];
  puint64 local_308 [2];
  ulong local_2f8;
  puint64 pStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  puint64 pStack_2d0;
  ulong auStack_2c8 [2];
  puint64 local_2b8;
  ulong auStack_2b0 [8];
  puint64 apStack_270 [5];
  ulong auStack_248 [2];
  puint64 apStack_238 [65];
  
  local_2d8 = ctx->hash[6];
  pStack_2d0 = ctx->hash[7];
  local_2e8 = ctx->hash[4];
  uStack_2e0 = ctx->hash[5];
  local_2f8 = ctx->hash[2];
  pStack_2f0 = ctx->hash[3];
  local_308[0] = ctx->hash[0];
  local_308[1] = ctx->hash[1];
  lVar2 = 0x10;
  ppVar3 = &local_2b8;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *ppVar3 = *data;
    data = data + 1;
    ppVar3 = ppVar3 + 1;
  }
  do {
    uVar4 = auStack_2c8[lVar2];
    uVar5 = local_308[lVar2 + -5];
    (&local_2b8)[lVar2] =
         (uVar4 >> 6 ^ (uVar4 << 3 | uVar4 >> 0x3d) ^ (uVar4 << 0x2d | uVar4 >> 0x13)) +
         (&pStack_2f0)[lVar2] + alStack_338[lVar2] +
         (uVar5 >> 7 ^
         (uVar5 << 0x38 | uVar5 >> 8) ^ (uVar5 >> 1 | (ulong)((uVar5 & 1) != 0) << 0x3f));
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x50);
  uVar4 = 0xfffffffffffffff8;
  do {
    lVar1 = ((local_2e8 << 0x17 | local_2e8 >> 0x29) ^
            (local_2e8 << 0x2e | local_2e8 >> 0x12) ^ (local_2e8 << 0x32 | local_2e8 >> 0xe)) +
            pStack_2d0 + pp_crypto_hash_sha2_512_K[uVar4 + 8] + auStack_2b0[uVar4 + 7] +
            ((uStack_2e0 ^ local_2d8) & local_2e8 ^ local_2d8);
    uVar6 = pStack_2f0 + lVar1;
    uVar5 = ((local_308[1] | local_308[0]) & local_2f8 | local_308[1] & local_308[0]) +
            ((local_308[0] << 0x19 | local_308[0] >> 0x27) ^
            (local_308[0] << 0x1e | local_308[0] >> 0x22) ^
            (local_308[0] << 0x24 | local_308[0] >> 0x1c)) + lVar1;
    lVar1 = ((uStack_2e0 ^ local_2e8) & uVar6 ^ uStack_2e0) + local_2d8 +
            pp_crypto_hash_sha2_512_K[uVar4 + 9] +
            ((uVar6 * 0x800000 | uVar6 >> 0x29) ^
            (uVar6 << 0x2e | uVar6 >> 0x12) ^ (uVar6 << 0x32 | uVar6 >> 0xe)) +
            auStack_2b0[uVar4 + 8];
    local_2f8 = local_2f8 + lVar1;
    local_2d8 = ((uVar5 | local_308[0]) & local_308[1] | uVar5 & local_308[0]) +
                ((uVar5 * 0x2000000 | uVar5 >> 0x27) ^
                (uVar5 * 0x40000000 | uVar5 >> 0x22) ^ (uVar5 << 0x24 | uVar5 >> 0x1c)) + lVar1;
    lVar1 = uStack_2e0 + pp_crypto_hash_sha2_512_K[uVar4 + 10] + auStack_2b0[uVar4 + 9] +
            ((uVar6 ^ local_2e8) & local_2f8 ^ local_2e8) +
            ((local_2f8 * 0x800000 | local_2f8 >> 0x29) ^
            (local_2f8 << 0x2e | local_2f8 >> 0x12) ^ (local_2f8 << 0x32 | local_2f8 >> 0xe));
    local_308[1] = local_308[1] + lVar1;
    uStack_2e0 = lVar1 + ((local_2d8 | uVar5) & local_308[0] | local_2d8 & uVar5) +
                         ((local_2d8 * 0x2000000 | local_2d8 >> 0x27) ^
                         (local_2d8 * 0x40000000 | local_2d8 >> 0x22) ^
                         (local_2d8 << 0x24 | local_2d8 >> 0x1c));
    lVar1 = local_2e8 + pp_crypto_hash_sha2_512_K[uVar4 + 0xb] + auStack_2b0[uVar4 + 10] +
            ((local_2f8 ^ uVar6) & local_308[1] ^ uVar6) +
            ((local_308[1] * 0x800000 | local_308[1] >> 0x29) ^
            (local_308[1] << 0x2e | local_308[1] >> 0x12) ^
            (local_308[1] << 0x32 | local_308[1] >> 0xe));
    local_308[0] = local_308[0] + lVar1;
    local_2e8 = lVar1 + ((uStack_2e0 | local_2d8) & uVar5 | uStack_2e0 & local_2d8) +
                        ((uStack_2e0 * 0x2000000 | uStack_2e0 >> 0x27) ^
                        (uStack_2e0 * 0x40000000 | uStack_2e0 >> 0x22) ^
                        (uStack_2e0 << 0x24 | uStack_2e0 >> 0x1c));
    lVar1 = uVar6 + pp_crypto_hash_sha2_512_K[uVar4 + 0xc] + auStack_2b0[uVar4 + 0xb] +
            ((local_308[1] ^ local_2f8) & local_308[0] ^ local_2f8) +
            ((local_308[0] * 0x800000 | local_308[0] >> 0x29) ^
            (local_308[0] << 0x2e | local_308[0] >> 0x12) ^
            (local_308[0] << 0x32 | local_308[0] >> 0xe));
    pStack_2d0 = uVar5 + lVar1;
    pStack_2f0 = ((local_2e8 | uStack_2e0) & local_2d8 | local_2e8 & uStack_2e0) +
                 ((local_2e8 * 0x2000000 | local_2e8 >> 0x27) ^
                 (local_2e8 * 0x40000000 | local_2e8 >> 0x22) ^
                 (local_2e8 << 0x24 | local_2e8 >> 0x1c)) + lVar1;
    lVar1 = local_2f8 + pp_crypto_hash_sha2_512_K[uVar4 + 0xd] + auStack_2b0[uVar4 + 0xc] +
            ((local_308[0] ^ local_308[1]) & pStack_2d0 ^ local_308[1]) +
            ((pStack_2d0 * 0x800000 | pStack_2d0 >> 0x29) ^
            (pStack_2d0 << 0x2e | pStack_2d0 >> 0x12) ^ (pStack_2d0 << 0x32 | pStack_2d0 >> 0xe));
    local_2d8 = local_2d8 + lVar1;
    local_2f8 = ((pStack_2f0 | local_2e8) & uStack_2e0 | pStack_2f0 & local_2e8) +
                ((pStack_2f0 * 0x2000000 | pStack_2f0 >> 0x27) ^
                (pStack_2f0 * 0x40000000 | pStack_2f0 >> 0x22) ^
                (pStack_2f0 << 0x24 | pStack_2f0 >> 0x1c)) + lVar1;
    lVar1 = local_308[1] + pp_crypto_hash_sha2_512_K[uVar4 + 0xe] + auStack_2b0[uVar4 + 0xd] +
            ((pStack_2d0 ^ local_308[0]) & local_2d8 ^ local_308[0]) +
            ((local_2d8 * 0x800000 | local_2d8 >> 0x29) ^
            (local_2d8 << 0x2e | local_2d8 >> 0x12) ^ (local_2d8 << 0x32 | local_2d8 >> 0xe));
    uStack_2e0 = uStack_2e0 + lVar1;
    local_308[1] = ((local_2f8 | pStack_2f0) & local_2e8 | local_2f8 & pStack_2f0) +
                   ((local_2f8 * 0x2000000 | local_2f8 >> 0x27) ^
                   (local_2f8 * 0x40000000 | local_2f8 >> 0x22) ^
                   (local_2f8 << 0x24 | local_2f8 >> 0x1c)) + lVar1;
    lVar1 = local_308[0] + pp_crypto_hash_sha2_512_K[uVar4 + 0xf] + auStack_2b0[uVar4 + 0xe] +
            ((local_2d8 ^ pStack_2d0) & uStack_2e0 ^ pStack_2d0) +
            ((uStack_2e0 * 0x800000 | uStack_2e0 >> 0x29) ^
            (uStack_2e0 << 0x2e | uStack_2e0 >> 0x12) ^ (uStack_2e0 << 0x32 | uStack_2e0 >> 0xe));
    local_2e8 = local_2e8 + lVar1;
    local_308[0] = ((local_308[1] | local_2f8) & pStack_2f0 | local_308[1] & local_2f8) +
                   ((local_308[1] * 0x2000000 | local_308[1] >> 0x27) ^
                   (local_308[1] * 0x40000000 | local_308[1] >> 0x22) ^
                   (local_308[1] << 0x24 | local_308[1] >> 0x1c)) + lVar1;
    uVar4 = uVar4 + 8;
  } while (uVar4 < 0x48);
  lVar1 = 0;
  do {
    ctx->hash[lVar1] = ctx->hash[lVar1] + local_308[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return;
}

Assistant:

static void
pp_crypto_hash_sha2_512_process (PHashSHA2_512	*ctx,
				 const puint64	data[16])
{
	puint64	tmp_sum1;
	puint64	tmp_sum2;
	puint64 W[80];
	puint64	A[8];
	puint	i;

	for (i = 0; i < 8; ++i)
		A[i] = ctx->hash[i];

	memcpy (W, data, 128);

	for (i = 16; i < 80; ++i)
		W[i] = P_SHA2_512_S1 (W[i -  2]) + W[i -  7] + P_SHA2_512_S0 (W[i - 15]) + W[i - 16];

	for (i = 0; i < 80; i += 8) {
		P_SHA2_512_P (A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i + 0], pp_crypto_hash_sha2_512_K[i + 0])
		P_SHA2_512_P (A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], W[i + 1], pp_crypto_hash_sha2_512_K[i + 1])
		P_SHA2_512_P (A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], W[i + 2], pp_crypto_hash_sha2_512_K[i + 2])
		P_SHA2_512_P (A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], W[i + 3], pp_crypto_hash_sha2_512_K[i + 3])
		P_SHA2_512_P (A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], W[i + 4], pp_crypto_hash_sha2_512_K[i + 4])
		P_SHA2_512_P (A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], W[i + 5], pp_crypto_hash_sha2_512_K[i + 5])
		P_SHA2_512_P (A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], W[i + 6], pp_crypto_hash_sha2_512_K[i + 6])
		P_SHA2_512_P (A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], W[i + 7], pp_crypto_hash_sha2_512_K[i + 7])
	}

	for (i = 0; i < 8; ++i)
		ctx->hash[i] += A[i];
}